

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

void __thiscall FIX::SessionState::onOutgoing(SessionState *this,string *string)

{
  if (this->m_pLog != (Log *)0x0) {
    Mutex::lock(&this->m_mutex);
    (*this->m_pLog->_vptr_Log[5])(this->m_pLog,string);
    Mutex::unlock(&this->m_mutex);
    return;
  }
  return;
}

Assistant:

void onOutgoing(const std::string &string) {
    if (!m_pLog) {
      return;
    }
    Locker l(m_mutex);
    m_pLog->onOutgoing(string);
  }